

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__jpeg_get_bit(stbi__jpeg *j)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = j->code_bits;
  if (iVar2 < 1) {
    stbi__grow_buffer_unsafe(j);
    iVar2 = j->code_bits;
  }
  uVar1 = j->code_buffer;
  j->code_buffer = uVar1 * 2;
  j->code_bits = iVar2 + -1;
  return uVar1 & 0x80000000;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bit(stbi__jpeg *j)
{
    unsigned int k;
    if (j->code_bits < 1) stbi__grow_buffer_unsafe(j);
    k = j->code_buffer;
    j->code_buffer <<= 1;
    --j->code_bits;
    return k & 0x80000000;
}